

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O2

Map<asl::String,_int> * __thiscall
asl::Map<asl::String,_int>::set(Map<asl::String,_int> *this,String *key,int *value)

{
  uint uVar1;
  KeyVal KStack_48;
  
  uVar1 = indexOf(this,key);
  if ((int)uVar1 < 0) {
    KeyVal::KeyVal(&KStack_48,key,value);
    Array<asl::Map<asl::String,_int>::KeyVal>::insert(&this->a,~uVar1,&KStack_48);
    String::~String(&KStack_48.key);
  }
  else {
    (this->a)._a[uVar1].value = *value;
  }
  return this;
}

Assistant:

Map& set(const K& key, const T& value)
	{
		int i=indexOf(key);
		if(i >= 0)
		{
			a[i].value = value;
			return *this;
		}
		a.insert(-i-1, KeyVal(key, value));
		return *this;
	}